

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O2

int32_t duckdb::Date::ExtractWeekNumberRegular(date_t date,bool monday_first)

{
  bool bVar1;
  date_t date_00;
  int32_t iVar2;
  int iVar3;
  undefined1 *puVar4;
  int iVar5;
  undefined7 in_register_00000031;
  int iVar6;
  int local_3c;
  int local_38;
  int32_t year;
  
  Convert(date,&year,&local_38,&local_3c);
  bVar1 = IsLeapYear(year);
  if (bVar1) {
    puVar4 = CUMULATIVE_LEAP_DAYS;
  }
  else {
    puVar4 = CUMULATIVE_DAYS;
  }
  iVar5 = local_3c + *(int *)(puVar4 + (long)local_38 * 4 + -4) + -1;
  date_00 = FromDate(year,1,1);
  iVar2 = ExtractISODayOfTheWeek(date_00);
  iVar3 = 0;
  iVar6 = 8 - iVar2;
  if (iVar2 == 1) {
    iVar6 = iVar3;
  }
  if ((int)CONCAT71(in_register_00000031,monday_first) == 0) {
    iVar6 = 7 - iVar2;
  }
  if (iVar6 <= iVar5) {
    iVar3 = (iVar5 - iVar6) / 7 + 1;
  }
  return iVar3;
}

Assistant:

int32_t Date::ExtractWeekNumberRegular(date_t date, bool monday_first) {
	int32_t year, month, day;
	Date::Convert(date, year, month, day);
	month -= 1;
	day -= 1;
	// get the day of the year
	auto day_of_the_year =
	    (Date::IsLeapYear(year) ? Date::CUMULATIVE_LEAP_DAYS[month] : Date::CUMULATIVE_DAYS[month]) + day;
	// now figure out the first monday or sunday of the year
	// what day is January 1st?
	auto day_of_jan_first = Date::ExtractISODayOfTheWeek(Date::FromDate(year, 1, 1));
	// monday = 1, sunday = 7
	int32_t first_week_start;
	if (monday_first) {
		// have to find next "1"
		if (day_of_jan_first == 1) {
			// jan 1 is monday: starts immediately
			first_week_start = 0;
		} else {
			// jan 1 is not monday: count days until next monday
			first_week_start = 8 - day_of_jan_first;
		}
	} else {
		first_week_start = 7 - day_of_jan_first;
	}
	if (day_of_the_year < first_week_start) {
		// day occurs before first week starts: week 0
		return 0;
	}
	return ((day_of_the_year - first_week_start) / 7) + 1;
}